

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_netstd_doc(t_netstd_generator *this,ostream *out,t_function *tfunction)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  t_function *ptVar3;
  ostream *poVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  pointer pptVar6;
  string str;
  stringstream ps;
  allocator local_2d3;
  allocator local_2d2;
  allocator local_2d1;
  string local_2d0;
  t_netstd_generator *local_2b0;
  ostream *local_2a8;
  t_function *local_2a0;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  if ((tfunction->super_t_doc).has_doc_ == true) {
    local_2b0 = this;
    local_2a8 = out;
    std::__cxx11::stringstream::stringstream(local_1b8);
    ptVar1 = tfunction->arglist_;
    local_2a0 = tfunction;
    for (pptVar6 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar6 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
      ptVar2 = *pptVar6;
      poVar4 = std::operator<<(&local_1a8,(string *)&::endl_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"<param name=\"");
      poVar4 = std::operator<<(poVar4,(string *)&ptVar2->name_);
      std::operator<<(poVar4,"\">");
      if ((ptVar2->super_t_doc).has_doc_ == true) {
        std::__cxx11::string::string((string *)&local_2d0,(string *)&(ptVar2->super_t_doc).doc_);
        local_298._M_dataplus._M_p._0_1_ = 10;
        _Var5 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_2d0._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(local_2d0._M_dataplus._M_p + local_2d0._M_string_length),
                           (_Iter_equals_val<const_char>)&local_298);
        std::__cxx11::string::erase
                  (&local_2d0,_Var5._M_current,
                   local_2d0._M_dataplus._M_p + local_2d0._M_string_length);
        std::operator<<(&local_1a8,(string *)&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      std::operator<<(&local_1a8,"</param>");
    }
    std::__cxx11::string::string((string *)&local_2d0,"",&local_2d1);
    std::__cxx11::string::string((string *)&local_298,"/// ",&local_2d2);
    ptVar3 = local_2a0;
    std::operator+(&local_238,"<summary>",&::endl_abi_cxx11_);
    std::operator+(&local_218,&local_238,&(ptVar3->super_t_doc).doc_);
    std::operator+(&local_1f8,&local_218,"</summary>");
    std::__cxx11::stringbuf::str();
    std::operator+(&local_1d8,&local_1f8,&local_258);
    std::__cxx11::string::string((string *)&local_278,"",&local_2d3);
    docstring_comment(local_2b0,local_2a8,&local_2d0,&local_298,&local_1d8,&local_278);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_doc(ostream& out, t_function* tfunction)
{
    if (tfunction->has_doc())
    {
        stringstream ps;
        const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
        vector<t_field*>::const_iterator p_iter;
        for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter)
        {
            t_field* p = *p_iter;
            ps << endl << "<param name=\"" << p->get_name() << "\">";
            if (p->has_doc())
            {
                string str = p->get_doc();
                str.erase(remove(str.begin(), str.end(), '\n'), str.end());
                ps << str;
            }
            ps << "</param>";
        }

        docstring_comment(out,
                                   "",
                                   "/// ",
                                   "<summary>" + endl + tfunction->get_doc() + "</summary>" + ps.str(),
                                   "");
    }
}